

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::inject_reduction_jobs(Group *this,View *view)

{
  bool bVar1;
  uint uVar2;
  pointer pvVar3;
  pointer pvVar4;
  View *pVVar5;
  Controller *pCVar6;
  float fVar7;
  float fVar8;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_88;
  _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
  local_80;
  const_iterator end_1;
  _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
  local_70;
  const_iterator v_1;
  _Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false> _Stack_60;
  uint8_t selector_1;
  _Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false> local_58;
  _Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false> local_50;
  _Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false> local_48;
  const_iterator vg;
  _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
  local_38;
  const_iterator end;
  _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
  local_28;
  const_iterator v;
  uint8_t selector;
  View *view_local;
  Group *this_local;
  
  fVar7 = get_c_act(this);
  fVar8 = get_c_act_thr(this);
  if (fVar8 < fVar7) {
    end.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
             std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::begin(&this->ipgm_views);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
    _Node_const_iterator
              (&local_28,
               (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                *)&end);
    vg.super__Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false>._M_cur =
         (_Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false>)
         std::
         unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
         ::end(&this->ipgm_views);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
    _Node_const_iterator
              (&local_38,
               (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                *)&vg);
    v.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
    _M_cur._7_1_ = 0;
    while (bVar1 = views_with_inputs_cond
                             (this,(uint8_t *)
                                   ((long)&v.
                                           super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                           ._M_cur + 7),&local_28,&local_38), bVar1) {
      pvVar4 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
               ::operator->(&local_28);
      pVVar5 = core::P<r_exec::View>::operator->(&pvVar4->second);
      fVar7 = View::get_act(pVVar5);
      fVar8 = get_act_thr(this);
      if (fVar8 < fVar7) {
        pvVar4 = std::__detail::
                 _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                 ::operator->(&local_28);
        pVVar5 = core::P<r_exec::View>::operator->(&pvVar4->second);
        pCVar6 = core::P<r_exec::Controller>::operator->(&pVVar5->controller);
        Controller::_take_input(pCVar6,view);
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
      operator++(&local_28);
    }
  }
  std::__detail::_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *)&local_48)
  ;
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
       ::begin(&this->viewing_groups);
  std::__detail::_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *)&local_50,
             (_Node_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *)&local_58);
  local_48._M_cur = local_50._M_cur;
  while( true ) {
    _Stack_60._M_cur =
         (__node_type *)
         std::
         unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
         ::end(&this->viewing_groups);
    bVar1 = std::__detail::operator!=(&local_48,&stack0xffffffffffffffa0);
    if (!bVar1) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::operator->
                       ((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *
                        )&local_48);
    if (((pvVar3->second & 1U) == 0) &&
       (uVar2 = (*(view->super_View).super__Object._vptr__Object[2])(), (uVar2 & 1) == 0)) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::operator->
                         ((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>
                           *)&local_48);
      end_1.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
                std::
                unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
                ::begin(&pvVar3->first->ipgm_views);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
      _Node_const_iterator
                (&local_70,
                 (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&end_1);
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::operator->
                         ((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>
                           *)&local_48);
      local_88._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
           ::end(&pvVar3->first->ipgm_views);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
      _Node_const_iterator
                (&local_80,
                 (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&local_88);
      v_1.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
      _M_cur._7_1_ = 0;
      while( true ) {
        pvVar3 = std::__detail::
                 _Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::
                 operator->((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>
                             *)&local_48);
        bVar1 = views_with_inputs_cond
                          (pvVar3->first,
                           (uint8_t *)
                           ((long)&v_1.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                   ._M_cur + 7),&local_70,&local_80);
        if (!bVar1) break;
        pvVar4 = std::__detail::
                 _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                 ::operator->(&local_70);
        pVVar5 = core::P<r_exec::View>::operator->(&pvVar4->second);
        fVar7 = View::get_act(pVVar5);
        pvVar3 = std::__detail::
                 _Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::
                 operator->((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>
                             *)&local_48);
        fVar8 = get_act_thr(pvVar3->first);
        if (fVar8 < fVar7) {
          pvVar4 = std::__detail::
                   _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                   ::operator->(&local_70);
          pVVar5 = core::P<r_exec::View>::operator->(&pvVar4->second);
          pCVar6 = core::P<r_exec::Controller>::operator->(&pVVar5->controller);
          Controller::_take_input(pCVar6,view);
        }
        std::__detail::
        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
        operator++(&local_70);
      }
    }
    std::__detail::_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *)
               &local_48);
  }
  return;
}

Assistant:

void Group::inject_reduction_jobs(View *view)
{
    if (get_c_act() > get_c_act_thr()) { // host is c-active.
        // build reduction jobs from host's own inputs and own overlays.
        FOR_ALL_VIEWS_WITH_INPUTS_BEGIN(this, v)

        if (v->second->get_act() > get_act_thr()) { //{ // active ipgm/icpp_pgm/rgrp view.
            v->second->controller->_take_input(view);    // view will be copied.
        }

        //std::cout<<std::hex<<(void *)v->second->controller<<std::dec<<" <- "<<view->object->get_oid()<<std::endl;}
        FOR_ALL_VIEWS_WITH_INPUTS_END
    }

    // build reduction jobs from host's own inputs and overlays from viewing groups, if no cov and view is not a notification.
    // NB: visibility is not transitive;
    // no shadowing: if a view alresady exists in the viewing group, there will be twice the reductions: all of the identicals will be trimmed down at injection time.
    std::unordered_map<Group *, bool>::const_iterator vg;

    for (vg = viewing_groups.begin(); vg != viewing_groups.end(); ++vg) {
        if (vg->second || view->isNotification()) { // no reduction jobs when cov==true or view is a notification.
            continue;
        }

        FOR_ALL_VIEWS_WITH_INPUTS_BEGIN(vg->first, v)

        if (v->second->get_act() > vg->first->get_act_thr()) { // active ipgm/icpp_pgm/rgrp view.
            v->second->controller->_take_input(view);    // view will be copied.
        }

        FOR_ALL_VIEWS_WITH_INPUTS_END
    }
}